

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O2

void __thiscall
Js::LineOffsetCache::AddLine
          (LineOffsetCache *this,Recycler *allocator,charcount_t characterOffset,
          charcount_t byteOffset)

{
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *list;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *alloc;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  undefined4 *puVar4;
  uint *puVar5;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar6;
  undefined1 local_60 [8];
  TrackAllocData data;
  charcount_t characterOffset_local;
  charcount_t byteOffset_local;
  
  list = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
         (this->lineCharacterOffsetCacheList).ptr;
  this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
            (this->lineByteOffsetCacheList).ptr;
  data.line = characterOffset;
  data._36_4_ = byteOffset;
  if (this_00 ==
      (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0 &&
      characterOffset != byteOffset) {
    local_60 = (undefined1  [8])
               &JsUtil::
                List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2b6b984;
    data.filename._0_4_ = 0xdf;
    alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_60);
    this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
              new<Memory::Recycler>(0x30,alloc,0x37a1d4);
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).alloc = allocator
    ;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01377ee8;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
         (uint *)0x0;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count = 0;
    this_00->length = 0;
    this_00->increment = 4;
    JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
    Copy<JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
              ((List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer> *)
               this_00,list);
    Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
    ::WriteBarrierSet(&this->lineByteOffsetCacheList,
                      (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)this_00);
LAB_006e68fb:
    JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this_00,(uint *)&data.field_0x24);
  }
  else if (this_00 !=
           (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0)
  goto LAB_006e68fb;
  JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (list,&data.line);
  pRVar6 = (this->lineCharacterOffsetCacheList).ptr;
  pRVar1 = (this->lineByteOffsetCacheList).ptr;
  if ((pRVar1 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) &&
     (pRVar1->count != pRVar6->count)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xea,
                                "(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count())"
                                ,
                                "this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count()"
                               );
    if (!bVar3) goto LAB_006e6a5b;
    *puVar4 = 0;
    pRVar6 = (this->lineCharacterOffsetCacheList).ptr;
  }
  if (1 < pRVar6->count) {
    puVar5 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                       (pRVar6,pRVar6->count + -2);
    if (data.line <= *puVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                  ,0xef,"(characterOffset > previousCharacterOffset)",
                                  "The character offsets must be inserted in increasing order per line."
                                 );
      if (!bVar3) goto LAB_006e6a5b;
      *puVar4 = 0;
    }
    pRVar6 = (this->lineByteOffsetCacheList).ptr;
    if (pRVar6 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
      puVar5 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                         (pRVar6,pRVar6->count + -2);
      if ((uint)data._36_4_ <= *puVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                    ,0xf3,"(byteOffset > previousByteOffset)",
                                    "The byte offsets must be inserted in increasing order per line."
                                   );
        if (!bVar3) {
LAB_006e6a5b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
  }
  return;
}

Assistant:

void LineOffsetCache::AddLine(Recycler * allocator, charcount_t characterOffset, charcount_t byteOffset)
    {
        LineOffsetCacheList * characterOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineCharacterOffsetCacheList;
        LineOffsetCacheList * byteOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineByteOffsetCacheList;
        if (characterOffset != byteOffset && byteOffsetList == nullptr)
        {
                byteOffsetList = RecyclerNew(allocator, LineOffsetCacheList, allocator);
                byteOffsetList->Copy(characterOffsetList);
                this->lineByteOffsetCacheList = byteOffsetList;
        }
        if (byteOffsetList != nullptr)
        {
            byteOffsetList->Add(byteOffset);
        }
        characterOffsetList->Add(characterOffset);

#if DBG
        Assert(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count());
        if (this->lineCharacterOffsetCacheList->Count() > 1)
        {
            // Ensure that the list remains sorted during insertion.
            charcount_t previousCharacterOffset = this->lineCharacterOffsetCacheList->Item(this->lineCharacterOffsetCacheList->Count() - 2);
            AssertMsg(characterOffset > previousCharacterOffset, "The character offsets must be inserted in increasing order per line.");
            if (this->lineByteOffsetCacheList != nullptr)
            {
                charcount_t previousByteOffset = this->lineByteOffsetCacheList->Item(this->lineByteOffsetCacheList->Count() - 2);
                AssertMsg(byteOffset > previousByteOffset, "The byte offsets must be inserted in increasing order per line.");
            }
        }
#endif // DBG
    }